

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_qcd_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  opj_bool oVar1;
  opj_event_mgr_t *in_RCX;
  int in_EDX;
  OPJ_UINT32 *in_stack_00000020;
  OPJ_BYTE *in_stack_00000028;
  OPJ_UINT32 in_stack_00000034;
  opj_j2k_v2_t *in_stack_00000038;
  opj_bool local_4;
  
  oVar1 = j2k_read_SQcd_SQcc(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000020
                             ,(opj_event_mgr *)p_j2k);
  if (oVar1 == 0) {
    opj_event_msg_v2(in_RCX,1,"Error reading QCD marker\n");
    local_4 = 0;
  }
  else if (in_EDX == 0) {
    j2k_copy_tile_quantization_parameters((opj_j2k_v2_t *)p_header_data);
    local_4 = 1;
  }
  else {
    opj_event_msg_v2(in_RCX,1,"Error reading QCD marker\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

opj_bool j2k_read_qcd_v2 (
				    opj_j2k_v2_t *p_j2k,
					OPJ_BYTE * p_header_data,
					OPJ_UINT32 p_header_size,
					struct opj_event_mgr * p_manager
					)
{
	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	if (! j2k_read_SQcd_SQcc(p_j2k,0,p_header_data,&p_header_size,p_manager)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading QCD marker\n");
		return OPJ_FALSE;
	}

	if (p_header_size != 0) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading QCD marker\n");
		return OPJ_FALSE;
	}

	/* Apply the quantization parameters to other components of the current tile or the m_default_tcp */
	j2k_copy_tile_quantization_parameters(p_j2k);

	return OPJ_TRUE;
}